

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

ALLEGRO_COLOR al_get_bitmap_blend_color(void)

{
  ALLEGRO_BITMAP *pAVar1;
  ALLEGRO_COLOR AVar2;
  
  pAVar1 = al_get_target_bitmap();
  if (pAVar1->use_bitmap_blender == false) {
    AVar2 = al_get_blend_color();
  }
  else {
    AVar2 = (pAVar1->blender).blend_color;
  }
  return AVar2;
}

Assistant:

ALLEGRO_COLOR al_get_bitmap_blend_color(void)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
   ALLEGRO_BLENDER *b;

   ASSERT(bitmap);

   if (!bitmap->use_bitmap_blender) {
      /* If no bitmap blender set, use TLS */
      return al_get_blend_color();
   }
   
   b = &bitmap->blender;
   return b->blend_color;
}